

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::RepeatedEventControlSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,RepeatedEventControlSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  SyntaxNode *node;
  size_t index_local;
  RepeatedEventControlSyntax *this_local;
  
  switch(index) {
  case 0:
    token.kind = (this->repeat).kind;
    token._2_1_ = (this->repeat).field_0x2;
    token.numFlags.raw = (this->repeat).numFlags.raw;
    token.rawLen = (this->repeat).rawLen;
    token.info = (this->repeat).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token);
    break;
  case 1:
    token_00.kind = (this->openParen).kind;
    token_00._2_1_ = (this->openParen).field_0x2;
    token_00.numFlags.raw = (this->openParen).numFlags.raw;
    token_00.rawLen = (this->openParen).rawLen;
    token_00.info = (this->openParen).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_00);
    break;
  case 2:
    node = &not_null<slang::syntax::ExpressionSyntax_*>::get(&this->expr)->super_SyntaxNode;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,node);
    break;
  case 3:
    token_01.kind = (this->closeParen).kind;
    token_01._2_1_ = (this->closeParen).field_0x2;
    token_01.numFlags.raw = (this->closeParen).numFlags.raw;
    token_01.rawLen = (this->closeParen).rawLen;
    token_01.info = (this->closeParen).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_01);
    break;
  case 4:
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,&this->eventControl->super_SyntaxNode);
    break;
  default:
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax RepeatedEventControlSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return repeat;
        case 1: return openParen;
        case 2: return expr.get();
        case 3: return closeParen;
        case 4: return eventControl;
        default: return nullptr;
    }
}